

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_fetch_anchor(yaml_parser_t *parser,yaml_token_type_t type)

{
  size_t *psVar1;
  yaml_token_t **tail;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  byte *pbVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  yaml_token_t *pyVar11;
  yaml_token_t *pyVar12;
  byte bVar13;
  long lStack_e0;
  byte *local_d0;
  byte *local_c8;
  byte *pbStack_c0;
  yaml_token_type_t local_b4;
  yaml_mark_t *local_b0;
  yaml_mark_t start_mark;
  yaml_token_t local_88;
  
  bVar13 = 0;
  iVar4 = yaml_parser_save_simple_key(parser);
  if (iVar4 != 0) {
    parser->simple_key_allowed = 0;
    local_c8 = (byte *)0x0;
    pbStack_c0 = (byte *)0x0;
    local_d0 = (byte *)yaml_malloc(0x10);
    if (local_d0 == (byte *)0x0) {
LAB_0010b3ff:
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      local_c8 = local_d0 + 0x10;
      local_d0[0] = 0;
      local_d0[1] = 0;
      local_d0[2] = 0;
      local_d0[3] = 0;
      local_d0[4] = 0;
      local_d0[5] = 0;
      local_d0[6] = 0;
      local_d0[7] = 0;
      local_d0[8] = 0;
      local_d0[9] = 0;
      local_d0[10] = 0;
      local_d0[0xb] = 0;
      local_d0[0xc] = 0;
      local_d0[0xd] = 0;
      local_d0[0xe] = 0;
      local_d0[0xf] = 0;
      start_mark.column = (parser->mark).column;
      start_mark.index._0_4_ = (undefined4)(parser->mark).index;
      start_mark.index._4_4_ = *(undefined4 *)((long)&(parser->mark).index + 4);
      start_mark.line._0_4_ = (undefined4)(parser->mark).line;
      start_mark.line._4_4_ = *(undefined4 *)((long)&(parser->mark).line + 4);
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      pbVar7 = (parser->buffer).pointer;
      sVar6 = parser->unread - 1;
      parser->unread = sVar6;
      bVar2 = *pbVar7;
      if ((char)bVar2 < '\0') {
        if ((bVar2 & 0xe0) == 0xc0) {
          lStack_e0 = 2;
        }
        else if ((bVar2 & 0xf0) == 0xe0) {
          lStack_e0 = 3;
        }
        else {
          lStack_e0 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
        }
      }
      else {
        lStack_e0 = 1;
      }
      (parser->buffer).pointer = pbVar7 + lStack_e0;
      pbStack_c0 = local_d0;
      local_b4 = type;
      if ((sVar6 != 0) || (iVar4 = yaml_parser_update_buffer(parser,1), iVar4 != 0)) {
        local_b0 = &parser->mark;
        iVar4 = 0;
        while( true ) {
          pbVar7 = (parser->buffer).pointer;
          bVar2 = *pbVar7;
          if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
              (bVar2 != 0x5f)) && (bVar2 != 0x2d)) break;
          if (local_c8 <= pbStack_c0 + 5) {
            iVar5 = yaml_string_extend(&local_d0,&pbStack_c0,&local_c8);
            if (iVar5 == 0) goto LAB_0010b3ff;
            pbVar7 = (parser->buffer).pointer;
            bVar2 = *pbVar7;
          }
          if ((char)bVar2 < '\0') {
            if ((bVar2 & 0xe0) == 0xc0) {
LAB_0010b391:
              (parser->buffer).pointer = pbVar7 + 1;
              *pbStack_c0 = *pbVar7;
              pbVar7 = (parser->buffer).pointer;
              pbStack_c0 = pbStack_c0 + 1;
              goto LAB_0010b3b5;
            }
            if ((bVar2 & 0xf0) == 0xe0) {
LAB_0010b36d:
              (parser->buffer).pointer = pbVar7 + 1;
              *pbStack_c0 = *pbVar7;
              pbVar7 = (parser->buffer).pointer;
              pbStack_c0 = pbStack_c0 + 1;
              goto LAB_0010b391;
            }
            if ((bVar2 & 0xf8) == 0xf0) {
              (parser->buffer).pointer = pbVar7 + 1;
              *pbStack_c0 = *pbVar7;
              pbVar7 = (parser->buffer).pointer;
              pbStack_c0 = pbStack_c0 + 1;
              goto LAB_0010b36d;
            }
          }
          else {
LAB_0010b3b5:
            (parser->buffer).pointer = pbVar7 + 1;
            *pbStack_c0 = *pbVar7;
            pbStack_c0 = pbStack_c0 + 1;
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          psVar1 = &parser->unread;
          *psVar1 = *psVar1 - 1;
          if ((*psVar1 == 0) && (iVar5 = yaml_parser_update_buffer(parser,1), iVar5 == 0))
          goto LAB_0010b405;
          iVar4 = iVar4 + -1;
        }
        if ((iVar4 != 0) &&
           ((((uVar10 = (uint)bVar2, uVar10 < 0x3b &&
              ((0x400102100002601U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) ||
             ((bVar2 - 0x3f < 0x3f &&
              ((0x4000000240000003U >> ((ulong)(bVar2 - 0x3f) & 0x3f) & 1) != 0)))) ||
            (((uVar10 != 0xe2 && (uVar10 == 0xc2)) && (pbVar7[1] == 0x85)))))) {
          local_88.data.tag.suffix = (yaml_char_t *)0x0;
          local_88.data._16_8_ = 0;
          local_88.start_mark.index = CONCAT44(start_mark.index._4_4_,(undefined4)start_mark.index);
          local_88.start_mark.line = CONCAT44(start_mark.line._4_4_,(undefined4)start_mark.line);
          local_88.start_mark.column = start_mark.column;
          local_88.end_mark.index = local_b0->index;
          local_88.end_mark.line = local_b0->line;
          local_88.end_mark.column = local_b0->column;
          local_88._0_8_ = (ulong)(local_b4 == YAML_ANCHOR_TOKEN) | 0x12;
          local_88.data.tag.handle = local_d0;
          tail = &(parser->tokens).tail;
          pyVar12 = (parser->tokens).tail;
          if (pyVar12 == (parser->tokens).end) {
            iVar4 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                      &(parser->tokens).end);
            if (iVar4 == 0) {
              parser->error = YAML_MEMORY_ERROR;
              yaml_token_delete(&local_88);
              return 0;
            }
            pyVar12 = *tail;
          }
          *tail = pyVar12 + 1;
          pyVar11 = &local_88;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar3 = *(undefined4 *)&pyVar11->field_0x4;
            pyVar12->type = pyVar11->type;
            *(undefined4 *)&pyVar12->field_0x4 = uVar3;
            pyVar11 = (yaml_token_t *)((long)pyVar11 + ((ulong)bVar13 * -2 + 1) * 8);
            pyVar12 = (yaml_token_t *)((long)pyVar12 + (ulong)bVar13 * -0x10 + 8);
          }
          return 1;
        }
        pcVar9 = "while scanning an alias";
        if (local_b4 == YAML_ANCHOR_TOKEN) {
          pcVar9 = "while scanning an anchor";
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = pcVar9;
        (parser->context_mark).index = CONCAT44(start_mark.index._4_4_,(undefined4)start_mark.index)
        ;
        (parser->context_mark).line = CONCAT44(start_mark.line._4_4_,(undefined4)start_mark.line);
        (parser->context_mark).column = start_mark.column;
        parser->problem = "did not find expected alphabetic or numeric character";
        sVar6 = local_b0->line;
        (parser->problem_mark).index = local_b0->index;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = local_b0->column;
      }
    }
LAB_0010b405:
    yaml_free(local_d0);
  }
  return 0;
}

Assistant:

static int
yaml_parser_fetch_anchor(yaml_parser_t *parser, yaml_token_type_t type)
{
    yaml_token_t token;

    /* An anchor or an alias could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow an anchor or an alias. */

    parser->simple_key_allowed = 0;

    /* Create the ALIAS or ANCHOR token and append it to the queue. */

    if (!yaml_parser_scan_anchor(parser, &token, type))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }
    return 1;
}